

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O3

ChVector<double> *
chrono::fea::InterpDeriv_xi1
          (ChVector<double> *__return_storage_ptr__,ChVector<double> *v,double *xi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  ChVector<double> *in_RAX;
  double in_XMM0_Qa;
  
  dVar5 = (in_XMM0_Qa + 1.0) * 0.25;
  dVar6 = (in_XMM0_Qa + 1.0) * -0.25;
  dVar7 = (1.0 - in_XMM0_Qa) * -0.25;
  dVar1 = v->m_data[2];
  dVar2 = v[1].m_data[2];
  dVar8 = (1.0 - in_XMM0_Qa) * 0.25;
  dVar3 = v[2].m_data[2];
  dVar4 = v[3].m_data[2];
  dVar9 = v->m_data[1];
  dVar10 = v[1].m_data[1];
  dVar11 = v[2].m_data[1];
  dVar12 = v[3].m_data[1];
  __return_storage_ptr__->m_data[0] =
       dVar5 * v->m_data[0] + dVar6 * v[1].m_data[0] + dVar7 * v[2].m_data[0] +
       dVar8 * v[3].m_data[0];
  __return_storage_ptr__->m_data[1] =
       dVar5 * dVar9 + dVar6 * dVar10 + dVar7 * dVar11 + dVar8 * dVar12;
  __return_storage_ptr__->m_data[2] = dVar5 * dVar1 + dVar6 * dVar2 + dVar7 * dVar3 + dVar8 * dVar4;
  return in_RAX;
}

Assistant:

static ChVector<> InterpDeriv_xi1(const ChVector<>* const v, const double xi[2]) {
    ChVector<> r = v[0] * L1_1(xi) + v[1] * L2_1(xi) + v[2] * L3_1(xi) + v[3] * L4_1(xi);
    return r;
}